

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.h
# Opt level: O2

void __thiscall
crnlib::dxt_hc::color_cluster::color_cluster(color_cluster *this,color_cluster *param_1)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    vector<unsigned_int>::vector
              ((vector<unsigned_int> *)((long)&this->blocks[0].m_p + lVar2),
               (vector<unsigned_int> *)((long)&param_1->blocks[0].m_p + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x30);
  vector<crnlib::color_quad<unsigned_char,_int>_>::vector(&this->pixels,&param_1->pixels);
  uVar1 = param_1->second_endpoint;
  this->first_endpoint = param_1->first_endpoint;
  this->second_endpoint = uVar1;
  lVar2 = 0;
  do {
    this->color_values[lVar2].field_0.field_0.r = param_1->color_values[lVar2].field_0.field_0.r;
    this->color_values[lVar2].field_0.field_0.g = param_1->color_values[lVar2].field_0.field_0.g;
    this->color_values[lVar2].field_0.field_0.b = param_1->color_values[lVar2].field_0.field_0.b;
    this->color_values[lVar2].field_0.field_0.a = param_1->color_values[lVar2].field_0.field_0.a;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return;
}

Assistant:

color_cluster() : first_endpoint(0), second_endpoint(0) {}